

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

ostream * tchecker::parsing::operator<<(ostream *os,attr_t *attr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,(string *)attr);
  poVar1 = std::operator<<(poVar1,": ");
  std::operator<<(poVar1,(string *)&attr->_value);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attr_t const & attr)
{
  os << attr.key() << ": " << attr.value();
  return os;
}